

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::TriageCompareEdgeDistance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *a0,Vector3<long_double> *a1,
              longdouble r2)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  longdouble lVar16;
  Vector3<long_double> n;
  Vector3<long_double> local_58;
  
  lVar9 = *(longdouble *)(a0->c_ + 1);
  lVar10 = *(longdouble *)(a0->c_ + 2);
  lVar8 = *(longdouble *)(a1->c_ + 1);
  lVar12 = *(longdouble *)(a1->c_ + 2);
  local_58.c_[0]._0_10_ = (lVar9 - lVar8) * (lVar12 + lVar10) - (lVar9 + lVar8) * (lVar10 - lVar12);
  lVar13 = *(longdouble *)a0->c_;
  lVar1 = *(longdouble *)a1->c_;
  local_58.c_[1]._0_10_ =
       (lVar10 - lVar12) * (lVar13 + lVar1) - (lVar12 + lVar10) * (lVar13 - lVar1);
  local_58.c_[2]._0_10_ = (lVar13 - lVar1) * (lVar9 + lVar8) - (lVar9 - lVar8) * (lVar13 + lVar1);
  lVar2 = *(longdouble *)(x->c_ + 2);
  lVar3 = *(longdouble *)(x->c_ + 1);
  lVar11 = local_58.c_[1]._0_10_ * lVar2 - local_58.c_[2]._0_10_ * lVar3;
  lVar4 = *(longdouble *)x->c_;
  lVar16 = local_58.c_[2]._0_10_ * lVar4 - local_58.c_[0]._0_10_ * lVar2;
  lVar14 = local_58.c_[0]._0_10_ * lVar3 - local_58.c_[1]._0_10_ * lVar4;
  lVar15 = (lVar10 - lVar2) * lVar14 +
           (lVar13 - lVar4) * lVar11 + (longdouble)0 + (lVar9 - lVar3) * lVar16;
  lVar12 = (lVar1 - lVar4) * lVar11 + (longdouble)0 + (lVar8 - lVar3) * lVar16 +
           (lVar12 - lVar2) * lVar14;
  lVar13 = local_58.c_[2]._0_10_ * local_58.c_[2]._0_10_ +
           local_58.c_[1]._0_10_ * local_58.c_[1]._0_10_ +
           local_58.c_[0]._0_10_ * local_58.c_[0]._0_10_;
  lVar9 = in_ST0;
  lVar10 = in_ST0;
  sqrtl();
  lVar8 = (in_ST0 * (longdouble)8.118802153517006 + (longdouble)6.153480596427404e-15) *
          (longdouble)5.421011e-20;
  sqrtl();
  sqrtl();
  if ((ABS(lVar15) < lVar8 * lVar9) || (ABS(lVar12) < lVar8 * lVar10)) {
    iVar5 = TriageCompareDistance<long_double>(x,a0,r2);
    iVar6 = TriageCompareDistance<long_double>(x,a1,r2);
    if (iVar6 < iVar5) {
      iVar5 = iVar6;
    }
    if ((longdouble)k45Degrees <= r2) {
      iVar6 = TriageCompareLineCos2Distance<long_double>(x,a0,a1,r2,&local_58,in_ST0,lVar13);
    }
    else {
      iVar6 = TriageCompareLineSin2Distance<long_double>(x,a0,a1,r2,&local_58,in_ST0,lVar13);
    }
    iVar7 = 0;
    if (iVar5 == iVar6) {
      iVar7 = iVar6;
    }
  }
  else if (((longdouble)0 <= lVar15) || (lVar12 <= (longdouble)0)) {
    iVar5 = TriageCompareDistance<long_double>(x,a0,r2);
    iVar7 = TriageCompareDistance<long_double>(x,a1,r2);
    if (iVar5 <= iVar7) {
      iVar7 = iVar5;
    }
  }
  else if ((longdouble)k45Degrees <= r2) {
    iVar7 = TriageCompareLineCos2Distance<long_double>(x,a0,a1,r2,&local_58,in_ST0,lVar13);
  }
  else {
    iVar7 = TriageCompareLineSin2Distance<long_double>(x,a0,a1,r2,&local_58,in_ST0,lVar13);
  }
  return iVar7;
}

Assistant:

int TriageCompareEdgeDistance(const Vector3<T>& x, const Vector3<T>& a0,
                              const Vector3<T>& a1, T r2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // First we need to decide whether the closest point is an edge endpoint or
  // somewhere in the interior.  To determine this we compute a plane
  // perpendicular to (a0, a1) that passes through X.  Letting M be the normal
  // to this plane, the closest point is in the edge interior if and only if
  // a0.M < 0 and a1.M > 0.  Note that we can use "<" rather than "<=" because
  // if a0.M or a1.M is zero exactly then it doesn't matter which code path we
  // follow (since the distance to an endpoint and the distance to the edge
  // interior are exactly the same in this case).
  Vector3<T> n = (a0 - a1).CrossProd(a0 + a1);
  Vector3<T> m = n.CrossProd(x);
  // For better accuracy when the edge (a0,a1) is very short, we subtract "x"
  // before computing the dot products with M.
  Vector3<T> a0_dir = a0 - x;
  Vector3<T> a1_dir = a1 - x;
  T a0_sign = a0_dir.DotProd(m);
  T a1_sign = a1_dir.DotProd(m);
  T n2 = n.Norm2();
  T n1 = sqrt(n2);
  T n1_error = ((3.5 + 8 / sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T a0_sign_error = n1_error * a0_dir.Norm();
  T a1_sign_error = n1_error * a1_dir.Norm();
  if (fabs(a0_sign) < a0_sign_error || fabs(a1_sign) < a1_sign_error) {
    // It is uncertain whether minimum distance is to an edge vertex or to the
    // edge interior.  We handle this by computing both distances and checking
    // whether they yield the same result.
    int vertex_sign = min(TriageCompareDistance(x, a0, r2),
                          TriageCompareDistance(x, a1, r2));
    int line_sign = TriageCompareLineDistance(x, a0, a1, r2, n, n1, n2);
    return (vertex_sign == line_sign) ? line_sign : 0;
  }
  if (a0_sign >= 0 || a1_sign <= 0) {
    // The minimum distance is to an edge endpoint.
    return min(TriageCompareDistance(x, a0, r2),
               TriageCompareDistance(x, a1, r2));
  } else {
    // The minimum distance is to the edge interior.
    return TriageCompareLineDistance(x, a0, a1, r2, n, n1, n2);
  }
}